

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZFMatrix<double> *coord,TPZVec<double> *par,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  double *pdVar6;
  int *piVar7;
  int64_t iVar8;
  TPZBaseMatrix *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  long *in_R8;
  double *in_R9;
  double dVar9;
  REAL RVar10;
  double dVar11;
  TPZManVector<double,_10> *this_00;
  long *in_stack_00000008;
  int c;
  int b_2;
  int a_3;
  int a_2;
  int b_1;
  int a_1;
  int b;
  TPZManVector<double,_10> parChanged;
  int a;
  TPZManVector<double,_3> DblendTemp;
  REAL blendTemp;
  int sidedim;
  TPZFNMatrix<9,_double> Inv;
  int dim;
  TPZGeoElSide neighbyside;
  int byside;
  TPZGeoMesh *gmesh;
  REAL Det;
  TPZFNMatrix<9,_double> Jneighbourhood;
  TPZFNMatrix<9,_double> JacTemp;
  TPZFNMatrix<9,_double> Ax;
  TPZFNMatrix<9,_double> J2;
  TPZFNMatrix<9,_double> J1;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  TPZStack<int,_10> LowAllSides;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_10> SidesCounter;
  int majorSide;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> SidePar;
  TPZManVector<double,_3> NeighPar;
  TPZGeoEl *gel;
  TPZFMatrix<double> *in_stack_ffffffffffffef68;
  TPZManVector<double,_10> *in_stack_ffffffffffffef70;
  TPZGeoMesh *in_stack_ffffffffffffef78;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffef80;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *in_stack_ffffffffffffef88;
  TPZFNMatrix<24,_double> *in_stack_ffffffffffffef90;
  TPZFMatrix<double> *this_01;
  double *in_stack_ffffffffffffef98;
  TPZManVector<double,_10> *in_stack_ffffffffffffefa0;
  int64_t in_stack_ffffffffffffefa8;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffefb0;
  undefined8 in_stack_ffffffffffffefb8;
  TPZFMatrix<double> *in_stack_ffffffffffffefc0;
  TPZFMatrix<double> *in_stack_ffffffffffffefc8;
  double dVar12;
  TPZGeoElSide *in_stack_ffffffffffffefd0;
  TPZFMatrix<double> *in_stack_fffffffffffff010;
  TPZFMatrix<double> *in_stack_fffffffffffff258;
  TPZVec<double> *in_stack_fffffffffffff260;
  TPZVec<double> *in_stack_fffffffffffff268;
  undefined8 in_stack_fffffffffffff270;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffff278;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  int local_b90;
  int local_b8c;
  int local_b14;
  TPZVec<double> local_b08;
  double local_ad0;
  int local_a98;
  int local_a94;
  int local_994;
  TPZGeoElSide local_990;
  int local_974;
  TPZGeoMesh *local_970;
  undefined8 local_880;
  TPZFMatrix<double> *in_stack_fffffffffffffb78;
  REAL *in_stack_fffffffffffffb80;
  TPZFMatrix<double> *in_stack_fffffffffffffb88;
  TPZFMatrix<double> *in_stack_fffffffffffffb90;
  TPZVec<double> *in_stack_fffffffffffffb98;
  TPZGeoElSide *in_stack_fffffffffffffba0;
  TPZVec<int> local_248 [2];
  TPZVec<int> local_200 [2];
  undefined8 local_1b8;
  TPZVec<double> local_1b0 [3];
  int local_13c;
  undefined8 local_138;
  undefined8 local_f8;
  TPZVec<double> local_f0 [5];
  TPZGeoEl *local_38;
  double *local_30;
  long *local_28;
  TPZBaseMatrix *local_20;
  TPZVec<double> *local_18;
  
  local_38 = *(TPZGeoEl **)(in_RDI + 0x30);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffef90,(int64_t)in_stack_ffffffffffffef88
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffef90,(int64_t)in_stack_ffffffffffffef88
            );
  local_f8 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffefa0,(int64_t)in_stack_ffffffffffffef98
             ,(double *)in_stack_ffffffffffffef90);
  local_138 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffefa0,(int64_t)in_stack_ffffffffffffef98
             ,(double *)in_stack_ffffffffffffef90);
  local_13c = 0x12;
  local_1b8 = 0;
  TPZManVector<double,_10>::TPZManVector
            (in_stack_ffffffffffffefa0,(int64_t)in_stack_ffffffffffffef98,
             (double *)in_stack_ffffffffffffef90);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffef80);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffef80);
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_ffffffffffffef90,(int64_t)in_stack_ffffffffffffef88,
             (int64_t)in_stack_ffffffffffffef80);
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_ffffffffffffef90,(int64_t)in_stack_ffffffffffffef88,
             (int64_t)in_stack_ffffffffffffef80);
  pztopology::TPZPyramid::Shape
            (&in_stack_ffffffffffffef70->super_TPZVec<double>,in_stack_ffffffffffffef68,
             (TPZFMatrix<double> *)0x164cecb);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffef80);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffef80);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffef80);
  local_880 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,(int64_t)in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef98);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffef80);
  local_970 = TPZGeoEl::Mesh(local_38);
  local_974 = local_13c;
  do {
    if (local_974 < 5) {
      for (local_b9c = 0; local_b9c < 5; local_b9c = local_b9c + 1) {
        for (local_ba0 = 0; local_ba0 < 3; local_ba0 = local_ba0 + 1) {
          for (local_ba4 = 0; local_ba4 < 3; local_ba4 = local_ba4 + 1) {
            pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_b9c);
            dVar9 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            dVar11 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            dVar12 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            *pdVar6 = (1.0 - dVar9) * dVar11 * dVar12 + *pdVar6;
          }
        }
      }
      TPZFMatrix<double>::operator=
                ((TPZFMatrix<double> *)in_stack_ffffffffffffef88,
                 &in_stack_ffffffffffffef80->super_TPZFMatrix<double>);
      (**(code **)(*local_28 + 0x68))(local_28,3);
      (**(code **)(*local_28 + 0x78))();
      iVar5 = TPZBaseMatrix::Rows(local_20);
      iVar8 = TPZBaseMatrix::Cols(local_20);
      (**(code **)(*in_stack_00000008 + 0x68))(in_stack_00000008,iVar5,iVar8);
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = 1.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = 1.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = 1.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = -dVar9 * dVar11 * *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = dVar9 * dVar11 * *pdVar6 + *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = dVar9 * dVar11 * *pdVar6 + *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = dVar9 * *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = *local_30 - dVar9 * *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = *local_30 - dVar9 * dVar11 * *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *local_30 = dVar9 * dVar11 * *pdVar6 + *local_30;
      bVar3 = IsZero(*local_30);
      if (bVar3) {
        RVar10 = ZeroTolerance();
        *local_30 = RVar10;
      }
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (-dVar9 * dVar11 + dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (dVar9 * dVar11 - dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (-dVar9 * dVar11 + dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (dVar9 * dVar11 - dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (-dVar9 * dVar11 + dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (dVar9 * dVar11 - dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar1 = *pdVar6;
      dVar2 = *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = (-dVar9 * dVar11 + dVar12 * dVar1) / dVar2;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar12 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar9 = (dVar9 * dVar11 - dVar12 * *pdVar6) / *local_30;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      *pdVar6 = dVar9;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      dVar11 = -*pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      this_01 = (TPZFMatrix<double> *)*pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this_01,(int64_t)in_stack_ffffffffffffef88,
                          (int64_t)in_stack_ffffffffffffef80);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (this_01,(int64_t)in_stack_ffffffffffffef88,(int64_t)dVar9);
      this_00 = (TPZManVector<double,_10> *)
                ((dVar11 * (double)this_01 + dVar9 * *pdVar6) / *local_30);
      pdVar6 = TPZFMatrix<double>::operator()(this_01,(int64_t)pdVar6,(int64_t)dVar9);
      *pdVar6 = (double)this_00;
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164ecb9);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164ecc6);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164ecd3);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164ece0);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164eced);
      TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x164ecfa);
      TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x164ed07);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x164ed14);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x164ed21);
      TPZManVector<double,_10>::~TPZManVector(this_00);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_00);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_00);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_00);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_00);
      return;
    }
    Neighbour(in_stack_ffffffffffffef88,(int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
              in_stack_ffffffffffffef78);
    iVar4 = TPZGeoElSide::Exists(&local_990);
    if (iVar4 == 0) {
LAB_0164d979:
      local_a98 = 0;
    }
    else {
      pztopology::TPZPyramid::LowerDimensionSides
                ((int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_ffffffffffffef78,
                 (int)((ulong)in_stack_ffffffffffffef70 >> 0x20));
      pztopology::TPZPyramid::LowerDimensionSides
                ((int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_ffffffffffffef78);
      Neighbour(in_stack_ffffffffffffef88,(int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
                in_stack_ffffffffffffef78);
      iVar4 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_ffffffffffffef70);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164d03a);
      local_994 = iVar4;
      TPZFNMatrix<9,_double>::TPZFNMatrix
                ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffef90,
                 (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80);
      local_a94 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_ffffffffffffef70);
      bVar3 = MapToNeighSide<double>
                        (in_stack_fffffffffffff278,(int)((ulong)in_stack_fffffffffffff270 >> 0x20),
                         (int)in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                         in_stack_fffffffffffff260,in_stack_fffffffffffff258);
      if (bVar3) {
        Neighbour(in_stack_ffffffffffffef88,(int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
                  in_stack_ffffffffffffef78);
        TPZGeoElSide::X(in_stack_ffffffffffffefd0,(TPZVec<double> *)in_stack_ffffffffffffefc8,
                        (TPZVec<double> *)in_stack_ffffffffffffefc0);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164d2eb);
        Neighbour(in_stack_ffffffffffffef88,(int)((ulong)in_stack_ffffffffffffef80 >> 0x20),
                  in_stack_ffffffffffffef78);
        TPZGeoElSide::Jacobian
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                   in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164d355);
        TPZFMatrix<double>::Transpose(in_stack_fffffffffffff010);
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0,(int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0,(int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
        local_ad0 = 0.0;
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)in_stack_ffffffffffffefa0,
                   (int64_t)in_stack_ffffffffffffef98,(double *)in_stack_ffffffffffffef90);
        for (local_b14 = 0; iVar5 = TPZVec<int>::NElements(local_200), local_b14 < iVar5;
            local_b14 = local_b14 + 1) {
          TPZVec<double>::NElements(local_18);
          TPZManVector<double,_10>::TPZManVector
                    ((TPZManVector<double,_10> *)in_stack_ffffffffffffef90,
                     (int64_t)in_stack_ffffffffffffef88);
          pztopology::TPZPyramid::Shape
                    (&in_stack_ffffffffffffef70->super_TPZVec<double>,in_stack_ffffffffffffef68,
                     (TPZFMatrix<double> *)0x164d470);
          TPZVec<int>::operator[](local_200,(long)local_b14);
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffef88,(int64_t)in_stack_ffffffffffffef80)
          ;
          local_ad0 = *pdVar6 + local_ad0;
          for (local_b8c = 0; local_b8c < 3; local_b8c = local_b8c + 1) {
            TPZVec<int>::operator[](local_200,(long)local_b14);
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            dVar9 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[](&local_b08,(long)local_b8c);
            *pdVar6 = dVar9 + *pdVar6;
          }
          TPZManVector<double,_10>::~TPZManVector(in_stack_ffffffffffffef70);
        }
        for (local_b90 = 0; local_b90 < 3; local_b90 = local_b90 + 1) {
          for (local_b94 = 0; local_b94 < 3; local_b94 = local_b94 + 1) {
            pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_974);
            dVar9 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            dVar2 = local_ad0;
            dVar11 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[](local_f0,(long)local_b90);
            dVar12 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[](&local_b08,(long)local_b94);
            dVar1 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffef90->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffef88,
                                (int64_t)in_stack_ffffffffffffef80);
            *pdVar6 = (1.0 - dVar9) * (dVar11 * dVar2 + dVar12 * dVar1) + *pdVar6;
          }
        }
        for (local_b98 = 0; iVar5 = TPZVec<int>::NElements(local_248), local_b98 < iVar5;
            local_b98 = local_b98 + 1) {
          pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_974);
          dVar9 = *pdVar6;
          piVar7 = TPZVec<int>::operator[](local_248,(long)local_b98);
          pdVar6 = TPZVec<double>::operator[](local_1b0,(long)*piVar7);
          *pdVar6 = (1.0 - dVar9) + *pdVar6;
        }
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_ffffffffffffef70)
        ;
        local_a98 = 0;
      }
      else {
        local_a98 = 4;
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x164d94e);
      if (local_a98 == 0) goto LAB_0164d979;
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164d991);
    local_974 = local_974 + -1;
  } while( true );
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}